

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BVHLoader.cpp
# Opt level: O3

float __thiscall Assimp::BVHLoader::GetNextTokenAsFloat(BVHLoader *this)

{
  float fVar1;
  char *pcVar2;
  float result;
  string token;
  float local_1cc;
  string local_1c8;
  string local_1a8;
  string local_188 [11];
  
  GetNextToken_abi_cxx11_(&local_1c8,this);
  if (local_1c8._M_string_length == 0) {
    local_188[0]._M_dataplus._M_p = (pointer)&local_188[0].field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_188,"Unexpected end of file while trying to read a float","");
    ThrowException(this,local_188);
  }
  local_1cc = 0.0;
  pcVar2 = fast_atoreal_move<float>(local_1c8._M_dataplus._M_p,&local_1cc,true);
  fVar1 = local_1cc;
  if (pcVar2 == local_1c8._M_dataplus._M_p + local_1c8._M_string_length) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
      operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
    }
    return fVar1;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_188);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_188,"Expected a floating point number, but found \"",0x2d);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_188,local_1c8._M_dataplus._M_p,local_1c8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_188,"\".",2);
  std::__cxx11::stringbuf::str();
  ThrowException(this,&local_1a8);
}

Assistant:

float BVHLoader::GetNextTokenAsFloat()
{
    std::string token = GetNextToken();
    if( token.empty())
        ThrowException( "Unexpected end of file while trying to read a float");

    // check if the float is valid by testing if the atof() function consumed every char of the token
    const char* ctoken = token.c_str();
    float result = 0.0f;
    ctoken = fast_atoreal_move<float>( ctoken, result);

    if( ctoken != token.c_str() + token.length())
        ThrowException( format() << "Expected a floating point number, but found \"" << token << "\"." );

    return result;
}